

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  ParseException *p;
  Element *local_268;
  Element *root;
  SExpressionParser parser;
  Element *local_210;
  allocator<char> local_201;
  undefined1 local_200 [6];
  bool checked;
  undefined1 local_1e0 [8];
  vector<char,_std::allocator<char>_> input;
  string local_1c0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  ShellOptions options;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  Name entry;
  char **argv_local;
  int argc_local;
  
  wasm::Name::Name((Name *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             ((long)&options.WasmShellOption.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"wasm-shell",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"Execute .wast files",
             (allocator<char> *)
             &input.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  ShellOptions::ShellOptions((ShellOptions *)local_168,&local_188,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &input.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  wasm::Options::parse((int)local_168,(char **)(ulong)(uint)argc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"infile",&local_201);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,(key_type *)local_200);
  wasm::read_file<std::vector<char,std::allocator<char>>>((string *)local_1e0,(BinaryOption)pmVar2);
  std::__cxx11::string::~string((string *)local_200);
  std::allocator<char>::~allocator(&local_201);
  if (((byte)local_168[0] & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"parsing text to s-expressions...\n");
  }
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_1e0);
  wasm::SExpressionParser::SExpressionParser((SExpressionParser *)&root,pcVar3);
  local_268 = local_210;
  Shell::Shell((Shell *)&p,(ShellOptions *)local_168);
  bVar1 = Shell::parseAndRun((Shell *)&p,local_268);
  Shell::~Shell((Shell *)&p);
  wasm::SExpressionParser::~SExpressionParser((SExpressionParser *)&root);
  if (bVar1) {
    Colors::green((ostream *)&std::cerr);
    Colors::bold((ostream *)&std::cerr);
    std::operator<<((ostream *)&std::cerr,"all checks passed.\n");
    Colors::normal((ostream *)&std::cerr);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_1e0);
  ShellOptions::~ShellOptions((ShellOptions *)local_168);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             ((long)&options.WasmShellOption.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  ShellOptions options("wasm-shell", "Execute .wast files");
  options.parse(argc, argv);

  auto input(
    read_file<std::vector<char>>(options.extra["infile"], Flags::Text));

  bool checked = false;
  try {
    if (options.debug) {
      std::cerr << "parsing text to s-expressions...\n";
    }
    SExpressionParser parser(input.data());
    Element& root = *parser.root;
    checked = Shell(options).parseAndRun(root);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    exit(1);
  }

  if (checked) {
    Colors::green(std::cerr);
    Colors::bold(std::cerr);
    std::cerr << "all checks passed.\n";
    Colors::normal(std::cerr);
  }
}